

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrgif.c
# Opt level: O1

void put_raw_pixel_rows(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  JDIMENSION JVar1;
  JSAMPROW pJVar2;
  short sVar3;
  long lVar4;
  
  JVar1 = cinfo->output_width;
  if (JVar1 != 0) {
    pJVar2 = *dinfo->buffer;
    lVar4 = 0;
    do {
      output((gif_dest_ptr)dinfo,(ushort)pJVar2[lVar4]);
      sVar3 = *(short *)((long)&dinfo[1].buffer + 2);
      if (sVar3 < *(short *)((long)&dinfo[1].put_pixel_rows + 4)) {
        sVar3 = sVar3 + 1;
      }
      else {
        output((gif_dest_ptr)dinfo,*(code_int *)((long)&dinfo[1].output_file + 4));
        sVar3 = (short)*(undefined4 *)((long)&dinfo[1].output_file + 4) + 2;
      }
      *(short *)((long)&dinfo[1].buffer + 2) = sVar3;
      lVar4 = lVar4 + 1;
    } while (JVar1 != (JDIMENSION)lVar4);
  }
  return;
}

Assistant:

METHODDEF(void)
put_raw_pixel_rows(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
                   JDIMENSION rows_supplied)
{
  gif_dest_ptr dest = (gif_dest_ptr)dinfo;
  register JSAMPROW ptr;
  register JDIMENSION col;
  code_int c;

  ptr = dest->pub.buffer[0];
  for (col = cinfo->output_width; col > 0; col--) {
    c = (code_int)(*ptr++);
    /* Accept and output one pixel value.
     * The given value must be less than n_bits wide.
     */

    /* Output the given pixel value as a symbol. */
    output(dest, c);
    /* Issue Clear codes often enough to keep the reader from ratcheting up
     * its symbol size.
     */
    if (dest->code_counter < dest->maxcode) {
      dest->code_counter++;
    } else {
      output(dest, dest->ClearCode);
      dest->code_counter = dest->ClearCode + 2; /* reset the counter */
    }
  }
}